

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O1

ostream * Gs::Details::ShiftAffineMatrixOStream<Gs::AffineMatrix4T<float>,float>
                    (ostream *stream,AffineMatrix4T<float> *mat)

{
  ulong uVar1;
  undefined1 uVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  size_t c;
  long lVar6;
  float *pfVar7;
  size_t lengths [4];
  char *local_88;
  long local_80;
  char local_78 [16];
  long local_68;
  float *local_60;
  ulong auStack_58 [5];
  
  lVar6 = 0;
  pfVar7 = mat->m_;
  do {
    auStack_58[lVar6] = 0;
    lVar5 = 0;
    do {
      sVar3 = Length<float>((float *)((long)pfVar7 + lVar5));
      if (sVar3 < auStack_58[lVar6]) {
        sVar3 = auStack_58[lVar6];
      }
      auStack_58[lVar6] = sVar3;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    lVar6 = lVar6 + 1;
    pfVar7 = pfVar7 + 3;
  } while (lVar6 != 4);
  lVar6 = 0;
  do {
    uVar2 = 0x7c;
    if (lVar6 == 0) {
      uVar2 = 0x2f;
    }
    local_68 = lVar6;
    local_88._0_1_ = uVar2;
    std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_88,1);
    lVar5 = 0;
    local_60 = mat->m_;
    do {
      uVar1 = auStack_58[lVar5];
      sVar3 = Length<float>(mat->m_);
      local_88 = local_78;
      std::__cxx11::string::_M_construct((ulong)&local_88,((char)uVar1 - (char)sVar3) + '\x01');
      std::__ostream_insert<char,std::char_traits<char>>(stream,local_88,local_80);
      if (local_88 != local_78) {
        operator_delete(local_88);
      }
      poVar4 = std::ostream::_M_insert<double>((double)mat->m_[0]);
      local_88._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_88,1);
      lVar6 = local_68;
      lVar5 = lVar5 + 1;
      mat = (AffineMatrix4T<float> *)((long)mat + 0xc);
    } while (lVar5 != 4);
    local_88 = (char *)(CONCAT71(local_88._1_7_,(local_68 != 0) << 5) | 0x5c);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_88,1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    lVar6 = lVar6 + 1;
    mat = (AffineMatrix4T<float> *)(local_60 + 1);
  } while (lVar6 != 3);
  local_88 = (char *)CONCAT71(local_88._1_7_,0x5c);
  std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_88,1);
  lVar6 = 0;
  do {
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,(char)auStack_58[lVar6]);
    std::__ostream_insert<char,std::char_traits<char>>(stream,local_88,local_80);
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    lVar5 = lVar6 + 1;
    local_88 = (char *)(CONCAT71(local_88._1_7_,lVar6 == 3) | 0x30);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_88,1);
    local_88._0_1_ = 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_88,1);
    lVar6 = lVar5;
  } while (lVar5 != 4);
  local_88 = (char *)CONCAT71(local_88._1_7_,0x2f);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,(char *)&local_88,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return stream;
}

Assistant:

std::ostream& ShiftAffineMatrixOStream(std::ostream& stream, const M& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[M::columnsSparse];

    for (std::size_t c = 0; c < M::columnsSparse; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < M::rowsSparse; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    #if GS_ROW_VECTORS

    /* Write each row */
    for (std::size_t r = 0; r < M::rowsSparse; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == M::rowsSparse ? '\\' : '|');

        for (std::size_t c = 0; c < M::columnsSparse; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        /* Write implicit column */
        stream << ' ' << (r + 1 == M::rowsSparse ? '1' : '0');
        stream << ' ' << (r == 0 ? '\\' : r + 1 == M::rowsSparse ? '/' : '|')  << std::endl;
    }

    #else

    /* Write each row */
    for (std::size_t r = 0; r < M::rowsSparse; ++r)
    {
        stream << (r == 0 ? '/' : '|');

        for (std::size_t c = 0; c < M::columnsSparse; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : '|')  << std::endl;
    }

    /* Write implicit row */
    stream << '\\';

    for (std::size_t c = 0; c < M::columnsSparse; ++c)
    {
        stream << std::string(lengths[c], ' ');
        stream << (c + 1 == M::columnsSparse ? '1' : '0') << ' ';
    }

    stream << '/' << std::endl;

    #endif

    return stream;
}